

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaeValidator.cpp
# Opt level: O0

int __thiscall opencollada::DaeValidator::checkLinks(DaeValidator *this,Dae *dae)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  string *psVar4;
  pointer ppVar5;
  Dae *in_RSI;
  const_iterator id_2;
  __tuple_element_t<1UL,_tuple<unsigned_long,_basic_string<char>_>_> *idref;
  __tuple_element_t<0UL,_tuple<unsigned_long,_basic_string<char>_>_> *line_1;
  tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *IDREF;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_1;
  iterator id_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ext_ids;
  const_iterator it;
  const_iterator id;
  Uri no_fragment_uri;
  __tuple_element_t<1UL,_tuple<unsigned_long,_Uri>_> *uri;
  __tuple_element_t<0UL,_tuple<unsigned_long,_Uri>_> *line;
  tuple<unsigned_long,_opencollada::Uri> *t;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::tuple<unsigned_long,_opencollada::Uri>,_std::allocator<std::tuple<unsigned_long,_opencollada::Uri>_>_>
  *__range1;
  int result;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ids;
  Uri *in_stack_fffffffffffffcc8;
  Dae *in_stack_fffffffffffffcd0;
  ostream *in_stack_fffffffffffffcd8;
  Uri *in_stack_fffffffffffffd08;
  Uri *in_stack_fffffffffffffd10;
  iterator in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  _Self local_210;
  _Self local_208;
  __tuple_element_t<1UL,_tuple<unsigned_long,_basic_string<char>_>_> *local_200;
  ulong *local_1f8;
  reference local_1f0;
  tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1e8;
  __normal_iterator<const_std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1e0;
  vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1d8;
  _Self local_1d0;
  _Self local_1c8 [7];
  _Self local_190;
  _Self local_188;
  _Self local_180;
  _Self local_178;
  allocator local_169;
  string local_168 [248];
  string local_70 [32];
  __tuple_element_t<1UL,_tuple<unsigned_long,_Uri>_> *local_50;
  ulong *local_48;
  reference local_40;
  tuple<unsigned_long,_opencollada::Uri> *local_38;
  __normal_iterator<const_std::tuple<unsigned_long,_opencollada::Uri>_*,_std::vector<std::tuple<unsigned_long,_opencollada::Uri>,_std::allocator<std::tuple<unsigned_long,_opencollada::Uri>_>_>_>
  local_30;
  vector<std::tuple<unsigned_long,_opencollada::Uri>,_std::allocator<std::tuple<unsigned_long,_opencollada::Uri>_>_>
  *local_28;
  uint local_1c;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  Dae *local_10;
  
  local_10 = in_RSI;
  poVar2 = ::std::operator<<((ostream *)&::std::cout,"Checking links...");
  ::std::ostream::operator<<(poVar2,::std::endl<char,std::char_traits<char>>);
  local_18 = Dae::getIds_abi_cxx11_(in_stack_fffffffffffffcd0);
  local_1c = 0;
  local_28 = Dae::getAnyURIs(local_10);
  local_30._M_current =
       (tuple<unsigned_long,_opencollada::Uri> *)
       ::std::
       vector<std::tuple<unsigned_long,_opencollada::Uri>,_std::allocator<std::tuple<unsigned_long,_opencollada::Uri>_>_>
       ::begin((vector<std::tuple<unsigned_long,_opencollada::Uri>,_std::allocator<std::tuple<unsigned_long,_opencollada::Uri>_>_>
                *)in_stack_fffffffffffffcc8);
  local_38 = (tuple<unsigned_long,_opencollada::Uri> *)
             ::std::
             vector<std::tuple<unsigned_long,_opencollada::Uri>,_std::allocator<std::tuple<unsigned_long,_opencollada::Uri>_>_>
             ::end((vector<std::tuple<unsigned_long,_opencollada::Uri>,_std::allocator<std::tuple<unsigned_long,_opencollada::Uri>_>_>
                    *)in_stack_fffffffffffffcc8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::tuple<unsigned_long,_opencollada::Uri>_*,_std::vector<std::tuple<unsigned_long,_opencollada::Uri>,_std::allocator<std::tuple<unsigned_long,_opencollada::Uri>_>_>_>
                             *)in_stack_fffffffffffffcd0,
                            (__normal_iterator<const_std::tuple<unsigned_long,_opencollada::Uri>_*,_std::vector<std::tuple<unsigned_long,_opencollada::Uri>,_std::allocator<std::tuple<unsigned_long,_opencollada::Uri>_>_>_>
                             *)in_stack_fffffffffffffcc8), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_std::tuple<unsigned_long,_opencollada::Uri>_*,_std::vector<std::tuple<unsigned_long,_opencollada::Uri>,_std::allocator<std::tuple<unsigned_long,_opencollada::Uri>_>_>_>
               ::operator*(&local_30);
    local_48 = ::std::get<0ul,unsigned_long,opencollada::Uri>
                         ((tuple<unsigned_long,_opencollada::Uri> *)0x186858);
    local_50 = ::std::get<1ul,unsigned_long,opencollada::Uri>
                         ((tuple<unsigned_long,_opencollada::Uri> *)0x18686d);
    Uri::nativePath_abi_cxx11_((Uri *)in_stack_fffffffffffffd38._M_node);
    bVar1 = Path::Exists((string *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
    ::std::__cxx11::string::~string(local_70);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      Uri::fragment_abi_cxx11_(local_50);
      uVar3 = ::std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        Uri::Uri(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_168,"",&local_169);
        Uri::setFragment((Uri *)in_stack_fffffffffffffcd0,&in_stack_fffffffffffffcc8->mUri);
        ::std::__cxx11::string::~string(local_168);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_169);
        Dae::getURI(local_10);
        bVar1 = Uri::operator==((Uri *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        if (bVar1) {
          Uri::fragment_abi_cxx11_(local_50);
          local_178._M_node =
               (_Base_ptr)
               ::std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffcc8,(key_type *)0x186a94);
          local_180._M_node =
               (_Base_ptr)
               ::std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffcc8);
          bVar1 = ::std::operator==(&local_178,&local_180);
          if (bVar1) {
            Dae::getURI(local_10);
            poVar2 = operator<<((ostream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,*local_48);
            poVar2 = ::std::operator<<(poVar2,": Can\'t resolve #");
            psVar4 = Uri::fragment_abi_cxx11_(local_50);
            poVar2 = ::std::operator<<(poVar2,(string *)psVar4);
            ::std::ostream::operator<<(poVar2,::std::endl<char,std::char_traits<char>>);
            local_1c = local_1c | 1;
          }
        }
        else {
          Dae::getExternalDAEs(local_10);
          local_188._M_node =
               (_Base_ptr)
               ::std::
               map<opencollada::Uri,_opencollada::Dae,_std::less<opencollada::Uri>,_std::allocator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>_>
               ::find((map<opencollada::Uri,_opencollada::Dae,_std::less<opencollada::Uri>,_std::allocator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>_>
                       *)in_stack_fffffffffffffcc8,(key_type *)0x186c66);
          Dae::getExternalDAEs(local_10);
          local_190._M_node =
               (_Base_ptr)
               ::std::
               map<opencollada::Uri,_opencollada::Dae,_std::less<opencollada::Uri>,_std::allocator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>_>
               ::end((map<opencollada::Uri,_opencollada::Dae,_std::less<opencollada::Uri>,_std::allocator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>_>
                      *)in_stack_fffffffffffffcc8);
          bVar1 = ::std::operator!=(&local_188,&local_190);
          if (bVar1) {
            ppVar5 = ::std::
                     _Rb_tree_const_iterator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>::
                     operator->((_Rb_tree_const_iterator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>
                                 *)0x186cd7);
            in_stack_fffffffffffffd57 =
                 XmlDoc::operator_cast_to_bool(&(ppVar5->second).super_XmlDoc);
            if ((bool)in_stack_fffffffffffffd57) {
              ::std::_Rb_tree_const_iterator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>::
              operator->((_Rb_tree_const_iterator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>
                          *)0x186d0c);
              Dae::getIds_abi_cxx11_(in_stack_fffffffffffffcd0);
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffcd0,
                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffcc8);
              Uri::fragment_abi_cxx11_(local_50);
              in_stack_fffffffffffffd38 =
                   ::std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffcd8,(key_type *)in_stack_fffffffffffffcd0);
              local_1c8[0]._M_node = in_stack_fffffffffffffd38._M_node;
              local_1d0._M_node =
                   (_Base_ptr)
                   ::std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffcc8);
              bVar1 = ::std::operator==(local_1c8,&local_1d0);
              if (bVar1) {
                Dae::getURI(local_10);
                poVar2 = operator<<((ostream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,*local_48);
                in_stack_fffffffffffffd10 = (Uri *)::std::operator<<(poVar2,": Can\'t resolve ");
                in_stack_fffffffffffffd08 =
                     (Uri *)operator<<((ostream *)in_stack_fffffffffffffcd0,
                                       in_stack_fffffffffffffcc8);
                ::std::ostream::operator<<
                          (in_stack_fffffffffffffd08,::std::endl<char,std::char_traits<char>>);
                local_1c = local_1c | 1;
              }
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x186e93);
            }
            else {
              Dae::getURI(local_10);
              poVar2 = operator<<((ostream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
              poVar2 = ::std::operator<<(poVar2,":");
              poVar2 = (ostream *)::std::ostream::operator<<(poVar2,*local_48);
              ::std::operator<<(poVar2,": ");
              in_stack_fffffffffffffcd8 =
                   operator<<((ostream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
              in_stack_fffffffffffffcd0 =
                   (Dae *)::std::operator<<(in_stack_fffffffffffffcd8,
                                            ": referenced file exists but has not been successfully loaded."
                                           );
              ::std::ostream::operator<<
                        (in_stack_fffffffffffffcd0,::std::endl<char,std::char_traits<char>>);
              local_1c = local_1c | 1;
            }
          }
        }
        Uri::~Uri((Uri *)in_stack_fffffffffffffcd0);
      }
    }
    else {
      Dae::getURI(local_10);
      poVar2 = operator<<((ostream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,*local_48);
      ::std::operator<<(poVar2,": Can\'t resolve ");
      poVar2 = operator<<((ostream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      ::std::ostream::operator<<(poVar2,::std::endl<char,std::char_traits<char>>);
      local_1c = local_1c | 1;
    }
    __gnu_cxx::
    __normal_iterator<const_std::tuple<unsigned_long,_opencollada::Uri>_*,_std::vector<std::tuple<unsigned_long,_opencollada::Uri>,_std::allocator<std::tuple<unsigned_long,_opencollada::Uri>_>_>_>
    ::operator++(&local_30);
  }
  local_1d8 = Dae::getIDREFs_abi_cxx11_(local_10);
  local_1e0._M_current =
       (tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)::std::
          vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin((vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffcc8);
  local_1e8 = (tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)::std::
                 vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end((vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffcc8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)in_stack_fffffffffffffcd0,
                            (__normal_iterator<const_std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)in_stack_fffffffffffffcc8), bVar1) {
    local_1f0 = __gnu_cxx::
                __normal_iterator<const_std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator*(&local_1e0);
    local_1f8 = ::std::get<0ul,unsigned_long,std::__cxx11::string>
                          ((tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x18701f);
    local_200 = ::std::get<1ul,unsigned_long,std::__cxx11::string>
                          ((tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x187034);
    local_208._M_node =
         (_Base_ptr)
         ::std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffcc8,(key_type *)0x187051);
    local_210._M_node =
         (_Base_ptr)
         ::std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffcc8);
    bVar1 = ::std::operator==(&local_208,&local_210);
    if (bVar1) {
      Dae::getURI(local_10);
      poVar2 = operator<<((ostream *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,*local_1f8);
      poVar2 = ::std::operator<<(poVar2,": Can\'t resolve #");
      poVar2 = ::std::operator<<(poVar2,(string *)local_200);
      ::std::ostream::operator<<(poVar2,::std::endl<char,std::char_traits<char>>);
      local_1c = local_1c | 1;
    }
    __gnu_cxx::
    __normal_iterator<const_std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&local_1e0);
  }
  return local_1c;
}

Assistant:

int DaeValidator::checkLinks(const Dae & dae) const
	{
		cout << "Checking links..." << endl;

		const auto & ids = dae.getIds();

		int result = 0;
		for (const auto & t : dae.getAnyURIs())
		{
			const auto & line = get<0>(t);
			const auto & uri = get<1>(t);
			if (!Path::Exists(uri.nativePath()))
			{
				cerr << dae.getURI() << ":" << line << ": Can't resolve " << uri << endl;
				result |= 1;
			}
			else if (!uri.fragment().empty())
			{
				Uri no_fragment_uri(uri);
				no_fragment_uri.setFragment("");
				if (no_fragment_uri == dae.getURI())
				{
					auto id = ids.find(uri.fragment());
					if (id == ids.end())
					{
						cerr << dae.getURI() << ":" << line << ": Can't resolve #" << uri.fragment() << endl;
						result |= 1;
					}
				}
				else
				{
					auto it = dae.getExternalDAEs().find(no_fragment_uri);
					if (it != dae.getExternalDAEs().end())
					{
						if (it->second)
						{
							auto ext_ids = it->second.getIds();
							auto id = ext_ids.find(uri.fragment());
							if (id == ext_ids.end())
							{
								cerr << dae.getURI() << ":" << line << ": Can't resolve " << uri << endl;
								result |= 1;
							}
						}
						else
						{
							cerr << dae.getURI() << ":" << line << ": " << uri << ": referenced file exists but has not been successfully loaded." << endl;
							result |= 1;
						}
					}
				}
			}
		}

		// IDREF
		for (const auto & IDREF : dae.getIDREFs())
		{
			const auto & line = get<0>(IDREF);
			const auto & idref = get<1>(IDREF);

			auto id = ids.find(idref);
			if (id == ids.end())
			{
				cerr << dae.getURI() << ":" << line << ": Can't resolve #" << idref << endl;
				result |= 1;
			}
		}

		return result;
	}